

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS(FixVariablePS *this,FixVariablePS *old)

{
  undefined8 uVar1;
  long in_RSI;
  PostStep *in_RDI;
  PostStep *in_stack_ffffffffffffffe0;
  
  PostStep::PostStep(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI->_vptr_PostStep = (_func_int **)&PTR__FixVariablePS_00897840;
  *(undefined4 *)&in_RDI[1]._vptr_PostStep = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)((long)&in_RDI[1]._vptr_PostStep + 4) = *(undefined4 *)(in_RSI + 0x2c);
  in_RDI[1].m_name = *(char **)(in_RSI + 0x30);
  uVar1 = *(undefined8 *)(in_RSI + 0x38);
  in_RDI[1].nCols = (int)uVar1;
  in_RDI[1].nRows = (int)((ulong)uVar1 >> 0x20);
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x40);
  in_RDI[1]._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x48);
  *(byte *)&in_RDI[2]._vptr_PostStep = *(byte *)(in_RSI + 0x50) & 1;
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffe0,(DSVectorBase<double> *)in_RDI);
  return;
}

Assistant:

FixVariablePS(const FixVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_val(old.m_val)
         , m_obj(old.m_obj)
         , m_lower(old.m_lower)
         , m_upper(old.m_upper)
         , m_correctIdx(old.m_correctIdx)
         , m_col(old.m_col)
      {}